

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

AutoFile * __thiscall
node::BlockManager::OpenBlockFile
          (AutoFile *__return_storage_ptr__,BlockManager *this,FlatFilePos *pos,bool fReadOnly)

{
  FILE *pFVar1;
  long in_FS_OFFSET;
  vector<std::byte,_std::allocator<std::byte>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar1 = FlatFileSeq::Open(&this->m_block_file_seq,pos,fReadOnly);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector(&local_48,&this->m_xor_key);
  __return_storage_ptr__->m_file = pFVar1;
  *(undefined4 *)
   &(__return_storage_ptr__->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
    _M_impl.super__Vector_impl_data._M_start =
       local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) =
       local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  *(undefined4 *)
   &(__return_storage_ptr__->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
    _M_impl.super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) =
       local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  (__return_storage_ptr__->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

AutoFile BlockManager::OpenBlockFile(const FlatFilePos& pos, bool fReadOnly) const
{
    return AutoFile{m_block_file_seq.Open(pos, fReadOnly), m_xor_key};
}